

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O2

int WebPIoInitFromOptions(WebPDecoderOptions *options,VP8Io *io,WEBP_CSP_MODE src_colorspace)

{
  int image_width;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint y;
  bool bVar6;
  int scaled_height;
  int scaled_width;
  ulong local_40;
  ulong local_38;
  
  image_width = io->width;
  uVar5 = io->height;
  if (options == (WebPDecoderOptions *)0x0) {
    io->use_cropping = 0;
LAB_00106eac:
    uVar3 = 0;
    y = 0;
    iVar2 = image_width;
    uVar4 = uVar5;
LAB_00106eb7:
    io->crop_left = uVar3;
    io->crop_top = y;
    io->crop_right = iVar2 + uVar3;
    io->crop_bottom = y + uVar5;
    io->mb_w = iVar2;
    io->mb_h = uVar5;
    if (options == (WebPDecoderOptions *)0x0) {
      io->use_scaling = 0;
      io->bypass_filtering = 0;
      io->fancy_upsampling = 1;
      return 1;
    }
    bVar6 = options->use_scaling == 0;
    io->use_scaling = (uint)!bVar6;
    if (bVar6) {
      bVar6 = true;
    }
    else {
      scaled_width = options->scaled_width;
      scaled_height = options->scaled_height;
      iVar2 = WebPRescalerGetScaledDimensions(iVar2,uVar5,&scaled_width,&scaled_height);
      if (iVar2 == 0) goto LAB_00106f4e;
      io->scaled_width = scaled_width;
      io->scaled_height = scaled_height;
      bVar6 = io->use_scaling == 0;
    }
    uVar5 = (uint)(options->bypass_filtering != 0);
    io->bypass_filtering = uVar5;
    io->fancy_upsampling = (uint)(options->no_fancy_upsampling == 0);
    iVar2 = 1;
    if (!bVar6) {
      uVar3 = 0;
      if (io->scaled_width < (image_width * 3) / 4) {
        uVar3 = (uint)(io->scaled_height < (int)(uVar4 * 3) / 4);
      }
      io->bypass_filtering = uVar3 | uVar5;
      io->fancy_upsampling = 0;
    }
  }
  else {
    bVar6 = options->use_cropping == 0;
    io->use_cropping = (uint)!bVar6;
    if (bVar6) goto LAB_00106eac;
    local_40 = (ulong)(uint)options->crop_width;
    uVar4 = options->crop_height;
    y = options->crop_top & 0xfffffffe;
    uVar3 = options->crop_left & 0xfffffffe;
    if (src_colorspace < MODE_YUV) {
      y = options->crop_top;
      uVar3 = options->crop_left;
    }
    local_38 = (ulong)uVar5;
    iVar1 = WebPCheckCropDimensions(image_width,uVar5,uVar3,y,options->crop_width,uVar4);
    uVar5 = uVar4;
    iVar2 = (int)local_40;
    uVar4 = (uint)local_38;
    if (iVar1 != 0) goto LAB_00106eb7;
LAB_00106f4e:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int WebPIoInitFromOptions(const WebPDecoderOptions* const options,
                          VP8Io* const io, WEBP_CSP_MODE src_colorspace) {
  const int W = io->width;
  const int H = io->height;
  int x = 0, y = 0, w = W, h = H;

  // Cropping
  io->use_cropping = (options != NULL) && options->use_cropping;
  if (io->use_cropping) {
    w = options->crop_width;
    h = options->crop_height;
    x = options->crop_left;
    y = options->crop_top;
    if (!WebPIsRGBMode(src_colorspace)) {   // only snap for YUV420
      x &= ~1;
      y &= ~1;
    }
    if (!WebPCheckCropDimensions(W, H, x, y, w, h)) {
      return 0;  // out of frame boundary error
    }
  }
  io->crop_left   = x;
  io->crop_top    = y;
  io->crop_right  = x + w;
  io->crop_bottom = y + h;
  io->mb_w = w;
  io->mb_h = h;

  // Scaling
  io->use_scaling = (options != NULL) && options->use_scaling;
  if (io->use_scaling) {
    int scaled_width = options->scaled_width;
    int scaled_height = options->scaled_height;
    if (!WebPRescalerGetScaledDimensions(w, h, &scaled_width, &scaled_height)) {
      return 0;
    }
    io->scaled_width = scaled_width;
    io->scaled_height = scaled_height;
  }

  // Filter
  io->bypass_filtering = (options != NULL) && options->bypass_filtering;

  // Fancy upsampler
#ifdef FANCY_UPSAMPLING
  io->fancy_upsampling = (options == NULL) || (!options->no_fancy_upsampling);
#endif

  if (io->use_scaling) {
    // disable filter (only for large downscaling ratio).
    io->bypass_filtering |= (io->scaled_width < W * 3 / 4) &&
                            (io->scaled_height < H * 3 / 4);
    io->fancy_upsampling = 0;
  }
  return 1;
}